

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O3

cupdlp_int csc_clear_host(CUPDLPcsc *csc)

{
  if (csc != (CUPDLPcsc *)0x0) {
    if (csc->colMatBeg != (cupdlp_int *)0x0) {
      free(csc->colMatBeg);
      csc->colMatBeg = (cupdlp_int *)0x0;
    }
    if (csc->colMatIdx != (cupdlp_int *)0x0) {
      free(csc->colMatIdx);
      csc->colMatIdx = (cupdlp_int *)0x0;
    }
    if (csc->colMatElem != (cupdlp_float *)0x0) {
      free(csc->colMatElem);
    }
    free(csc);
  }
  return 0;
}

Assistant:

cupdlp_int csc_clear_host(CUPDLPcsc *csc) {
  if (csc) {
    if (csc->colMatBeg) {
      cupdlp_free(csc->colMatBeg);
    }
    if (csc->colMatIdx) {
      cupdlp_free(csc->colMatIdx);
    }
    if (csc->colMatElem) {
      cupdlp_free(csc->colMatElem);
    }
    cupdlp_free(csc);
  }
  return 0;
}